

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int anotherValidCursor(BtCursor *pCur)

{
  int iVar1;
  BtCursor *local_20;
  BtCursor *pOther;
  BtCursor *pCur_local;
  
  local_20 = pCur->pBt->pCursor;
  while( true ) {
    if (local_20 == (BtCursor *)0x0) {
      return 0;
    }
    if (((local_20 != pCur) && (local_20->eState == '\0')) && (local_20->pPage == pCur->pPage))
    break;
    local_20 = local_20->pNext;
  }
  iVar1 = sqlite3CorruptError(0x12745);
  return iVar1;
}

Assistant:

static int anotherValidCursor(BtCursor *pCur){
  BtCursor *pOther;
  for(pOther=pCur->pBt->pCursor; pOther; pOther=pOther->pNext){
    if( pOther!=pCur
     && pOther->eState==CURSOR_VALID
     && pOther->pPage==pCur->pPage
    ){
      return SQLITE_CORRUPT_BKPT;
    }
  }
  return SQLITE_OK;
}